

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void slu_PrintInt10(char *name,int len,int *x)

{
  uint local_24;
  int i;
  int *x_local;
  int len_local;
  char *name_local;
  
  printf("%10s:",name);
  for (local_24 = 0; (int)local_24 < len; local_24 = local_24 + 1) {
    if ((int)local_24 % 10 == 0) {
      printf("\n\t[%2d-%2d]",(ulong)local_24,(ulong)(local_24 + 9));
    }
    printf("%6d",(ulong)(uint)x[(int)local_24]);
  }
  printf("\n");
  return;
}

Assistant:

void slu_PrintInt10(const char *name, int len, const int *x)
{
    register int i;
    
    printf("%10s:", name);
    for (i = 0; i < len; ++i)
    {
	if ( i % 10 == 0 ) printf("\n\t[%2d-%2d]", i, i + 9);
	printf("%6d", x[i]);
    }
    printf("\n");
}